

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O1

int __thiscall ev3dev::sensor::value(sensor *this,uint index)

{
  int iVar1;
  size_t sVar2;
  invalid_argument *this_00;
  char svalue [7];
  char acStack_48 [6];
  undefined1 uStack_42;
  string local_40;
  
  iVar1 = num_values(this);
  if ((int)index < iVar1) {
    builtin_strncpy(acStack_48,"value",5);
    uStack_42 = 0;
    acStack_48[5] = (char)index + '0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar2 = strlen(acStack_48);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,acStack_48,acStack_48 + sVar2);
    iVar1 = device::get_attr_int(&this->super_device,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    return iVar1;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"index");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int sensor::value(unsigned index) const {
    if (static_cast<int>(index) >= num_values())
        throw std::invalid_argument("index");

    char svalue[7] = "value0";
    svalue[5] += index;

    return get_attr_int(svalue);
}